

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::vector<unsigned_int>_>::~vector(vector<crnlib::vector<unsigned_int>_> *this)

{
  vector<crnlib::vector<unsigned_int>_> *this_local;
  
  if (this->m_p != (vector<unsigned_int> *)0x0) {
    scalar_type<crnlib::vector<unsigned_int>_>::destruct_array(this->m_p,this->m_size);
    crnlib_free(this->m_p);
  }
  return;
}

Assistant:

inline ~vector()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
            }
        }